

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall Transporter::Send(Transporter *this,uv_stream_t *handler,char *data,size_t len)

{
  bool bVar1;
  void *__s;
  char *base;
  uv_async_t *handle;
  uv_buf_t uVar2;
  uv_async_t *async;
  size_t local_40;
  char *newData;
  write_req_t *writeReq;
  size_t len_local;
  char *data_local;
  uv_stream_t *handler_local;
  Transporter *this_local;
  
  bVar1 = IsConnected(this);
  if (bVar1) {
    __s = operator_new(0xd8);
    memset(__s,0,0xd8);
    base = (char *)malloc(len);
    memcpy(base,data,len);
    uVar2 = uv_buf_init(base,(uint)len);
    async = (uv_async_t *)uVar2.base;
    *(uv_async_t **)((long)__s + 0xc0) = async;
    local_40 = uVar2.len;
    *(size_t *)((long)__s + 200) = local_40;
    *(uv_stream_t **)((long)__s + 0xd0) = handler;
    handle = (uv_async_t *)operator_new(0x80);
    handle->data = __s;
    uv_async_init(this->loop,handle,async_write);
    uv_async_send(handle);
  }
  return;
}

Assistant:

void Transporter::Send(uv_stream_t* handler, const char* data, size_t len)
{
	if (!IsConnected())
	{
		return;
	}
	auto* writeReq = new write_req_t();
	char* newData = static_cast<char*>(malloc(len));

	memcpy(newData, data, len);
	writeReq->buf = uv_buf_init(newData, len);
	writeReq->handler = handler;

	// thread safe:
	auto* async = new uv_async_t;
	async->data = writeReq;
	uv_async_init(loop, async, async_write);
	uv_async_send(async);
}